

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamFormatParser_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::SamFormatParser::ParsePGLine(SamFormatParser *this,string *line)

{
  bool bVar1;
  __type _Var2;
  reference pbVar3;
  undefined8 uVar4;
  CustomHeaderTag otherTag;
  string tokenValue;
  string tokenTag;
  const_iterator tokenEnd;
  const_iterator tokenIter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  SamProgram pg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc8;
  SamProgram *in_stack_fffffffffffffdd0;
  allocator *paVar5;
  value_type *in_stack_fffffffffffffdd8;
  vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>
  *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  undefined6 in_stack_fffffffffffffe00;
  undefined1 uVar6;
  allocator in_stack_fffffffffffffe07;
  SamProgram *in_stack_fffffffffffffe08;
  BamException *in_stack_fffffffffffffe10;
  allocator local_1d1;
  string local_1d0 [32];
  SamProgram *in_stack_fffffffffffffe50;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_118 [6];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [23];
  char in_stack_ffffffffffffffaf;
  string *in_stack_ffffffffffffffb0;
  SamFormatParser *in_stack_ffffffffffffffb8;
  
  SamProgram::SamProgram(in_stack_fffffffffffffe50);
  Split(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
  local_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(in_stack_fffffffffffffdc8);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffdd0,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffdc8);
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(in_stack_fffffffffffffdc8);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffdd0,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffdc8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffdd0,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffdc8), bVar1) {
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_118);
    std::__cxx11::string::substr((ulong)local_150,(ulong)pbVar3);
    pbVar3 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(local_118);
    std::__cxx11::string::substr((ulong)local_170,(ulong)pbVar3);
    _Var2 = std::operator==(in_stack_fffffffffffffdf0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
    if (_Var2) {
      std::__cxx11::string::operator=(local_c8,local_170);
    }
    else {
      _Var2 = std::operator==(in_stack_fffffffffffffdf0,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
      if (_Var2) {
        std::__cxx11::string::operator=(local_a8,local_170);
      }
      else {
        _Var2 = std::operator==(in_stack_fffffffffffffdf0,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
        if (_Var2) {
          std::__cxx11::string::operator=(local_e8,local_170);
        }
        else {
          _Var2 = std::operator==(in_stack_fffffffffffffdf0,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
          if (_Var2) {
            std::__cxx11::string::operator=(local_88,local_170);
          }
          else {
            _Var2 = std::operator==(in_stack_fffffffffffffdf0,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8)
                                   );
            if (_Var2) {
              std::__cxx11::string::operator=(local_68,local_170);
            }
            else {
              in_stack_fffffffffffffdf0 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffe50;
              CustomHeaderTag::CustomHeaderTag((CustomHeaderTag *)in_stack_fffffffffffffdd0);
              std::__cxx11::string::operator=((string *)in_stack_fffffffffffffdf0,local_150);
              std::__cxx11::string::operator=(local_190,local_170);
              std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::
              push_back(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
              CustomHeaderTag::~CustomHeaderTag((CustomHeaderTag *)in_stack_fffffffffffffdd0);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_150);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(local_118);
  }
  bVar1 = SamProgram::HasID((SamProgram *)0x1e5312);
  if (bVar1) {
    SamProgramChain::Add((SamProgramChain *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffde0);
    SamProgram::~SamProgram(in_stack_fffffffffffffdd0);
    return;
  }
  uVar6 = 1;
  uVar4 = __cxa_allocate_exception(0x28);
  paVar5 = &local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"SamFormatParser::ParsePGLine",paVar5);
  paVar5 = (allocator *)&stack0xfffffffffffffe07;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffe08,"@PG line is missing ID tag",paVar5);
  BamException::BamException
            (in_stack_fffffffffffffe10,&in_stack_fffffffffffffe08->CommandLine,
             (string *)CONCAT17(in_stack_fffffffffffffe07,CONCAT16(uVar6,in_stack_fffffffffffffe00))
            );
  __cxa_throw(uVar4,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void SamFormatParser::ParsePGLine(const string& line) {

    SamProgram pg;

    // split string into tokens
    vector<string> tokens = Split(line, Constants::SAM_TAB);

    // iterate over tokens
    vector<string>::const_iterator tokenIter = tokens.begin();
    vector<string>::const_iterator tokenEnd  = tokens.end();
    for ( ; tokenIter != tokenEnd; ++tokenIter ) {

        // get token tag/value
        const string tokenTag = (*tokenIter).substr(0,2);
        const string tokenValue = (*tokenIter).substr(3);

        // set program record contents
        if      ( tokenTag == Constants::SAM_PG_ID_TAG              ) pg.ID = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_NAME_TAG            ) pg.Name = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_COMMANDLINE_TAG     ) pg.CommandLine = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_PREVIOUSPROGRAM_TAG ) pg.PreviousProgramID = tokenValue;
        else if ( tokenTag == Constants::SAM_PG_VERSION_TAG         ) pg.Version = tokenValue;
        else { // custom tag
            CustomHeaderTag otherTag;
            otherTag.TagName  = tokenTag;
            otherTag.TagValue = tokenValue;
            pg.CustomTags.push_back(otherTag);
        }
    }

    // check for required tags
    if ( !pg.HasID() )
        throw BamException("SamFormatParser::ParsePGLine", "@PG line is missing ID tag");

    // store SAM program entry
    m_header.Programs.Add(pg);
}